

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void updateWindowMode(_GLFWwindow *window)

{
  Atom AVar1;
  Atom AVar2;
  unsigned_long uVar3;
  XSetWindowAttributes attributes;
  
  AVar1 = _glfw.x11.NET_WM_FULLSCREEN_MONITORS;
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != 0) {
      (*_glfw.x11.xlib.DeleteProperty)
                (_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_FULLSCREEN_MONITORS);
    }
    AVar2 = _glfw.x11.NET_WM_STATE_FULLSCREEN;
    AVar1 = _glfw.x11.NET_WM_STATE;
    if (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0 || _glfw.x11.NET_WM_STATE == 0) {
      attributes._88_8_ = attributes._88_8_ & 0xffffffff00000000;
      (*_glfw.x11.xlib.ChangeWindowAttributes)
                (_glfw.x11.display,(window->x11).handle,0x200,&attributes);
      (window->x11).overrideRedirect = 0;
    }
    else {
      memset((XEvent *)&attributes,0,0xc0);
      attributes.background_pixmap = CONCAT44(attributes.background_pixmap._4_4_,0x21);
      attributes._32_8_ = (window->x11).handle;
      attributes.backing_planes._0_4_ = 0x20;
      attributes._40_8_ = AVar1;
      attributes.backing_pixel = 0;
      attributes._64_8_ = AVar2;
      attributes.event_mask = 0;
      attributes.do_not_propagate_mask = 1;
      attributes.override_redirect = 0;
      attributes._92_4_ = 0;
      (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,_glfw.x11.root,0,0x180000,(XEvent *)&attributes)
      ;
    }
    if ((window->x11).transparent == 0) {
      (*_glfw.x11.xlib.DeleteProperty)
                (_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR);
    }
  }
  else {
    if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != 0) {
      uVar3 = (unsigned_long)(window->monitor->x11).index;
      memset((XEvent *)&attributes,0,0xc0);
      attributes.background_pixmap = CONCAT44(attributes.background_pixmap._4_4_,0x21);
      attributes._32_8_ = (window->x11).handle;
      attributes.backing_planes._0_4_ = 0x20;
      attributes._40_8_ = AVar1;
      attributes.override_redirect = 0;
      attributes._92_4_ = 0;
      attributes.backing_pixel = uVar3;
      attributes._64_8_ = uVar3;
      attributes.event_mask = uVar3;
      attributes.do_not_propagate_mask = uVar3;
      (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,_glfw.x11.root,0,0x180000,(XEvent *)&attributes)
      ;
    }
    AVar2 = _glfw.x11.NET_WM_STATE_FULLSCREEN;
    AVar1 = _glfw.x11.NET_WM_STATE;
    if (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0 || _glfw.x11.NET_WM_STATE == 0) {
      attributes.override_redirect = 1;
      (*_glfw.x11.xlib.ChangeWindowAttributes)
                (_glfw.x11.display,(window->x11).handle,0x200,&attributes);
      (window->x11).overrideRedirect = 1;
    }
    else {
      memset((XEvent *)&attributes,0,0xc0);
      attributes.background_pixmap = CONCAT44(attributes.background_pixmap._4_4_,0x21);
      attributes._32_8_ = (window->x11).handle;
      attributes.backing_planes._0_4_ = 0x20;
      attributes._40_8_ = AVar1;
      attributes.backing_pixel = 1;
      attributes._64_8_ = AVar2;
      attributes.event_mask = 0;
      attributes.do_not_propagate_mask = 1;
      attributes.override_redirect = 0;
      attributes._92_4_ = 0;
      (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,_glfw.x11.root,0,0x180000,(XEvent *)&attributes)
      ;
    }
    if ((window->x11).transparent == 0) {
      attributes.background_pixmap = 1;
      (*_glfw.x11.xlib.ChangeProperty)
                (_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20,0,
                 (uchar *)&attributes,1);
    }
  }
  return;
}

Assistant:

static void updateWindowMode(_GLFWwindow* window)
{
    if (window->monitor)
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_FULLSCREEN_MONITORS,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          0);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_ADD,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            // This is the butcher's way of removing window decorations
            // Setting the override-redirect attribute on a window makes the
            // window manager ignore the window completely (ICCCM, section 4)
            // The good thing is that this makes undecorated full screen windows
            // easy to do; the bad thing is that we have to do everything
            // manually and some things (like iconify/restore) won't work at
            // all, as those are tasks usually performed by the window manager

            XSetWindowAttributes attributes;
            attributes.override_redirect = True;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_TRUE;
        }

        // Enable compositor bypass
        if (!window->x11.transparent)
        {
            const unsigned long value = 1;

            XChangeProperty(_glfw.x11.display,  window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                            PropModeReplace, (unsigned char*) &value, 1);
        }
    }
    else
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_FULLSCREEN_MONITORS);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_REMOVE,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            XSetWindowAttributes attributes;
            attributes.override_redirect = False;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_FALSE;
        }

        // Disable compositor bypass
        if (!window->x11.transparent)
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR);
        }
    }
}